

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_calc_fontwidth(t_my_numbox *x)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar1 = 0x1f;
  if (uVar3 == 2) {
    iVar1 = 0x19;
  }
  iVar4 = 0x1b;
  if (uVar3 != 1) {
    iVar4 = iVar1;
  }
  uVar2 = (long)(x->x_gui).x_h / 2;
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_w =
       ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / (long)iVar1)
        + (x->x_numwidth * (x->x_gui).x_fontsize * iVar4) / 0x24 + 4) * iVar1;
  return;
}

Assistant:

void my_numbox_calc_fontwidth(t_my_numbox *x)
{
    int w, f = 31;

    if(x->x_gui.x_fsf.x_font_style == 1)
        f = 27;
    else if(x->x_gui.x_fsf.x_font_style == 2)
        f = 25;

    w = x->x_gui.x_fontsize * f * x->x_numwidth;
    w /= 36;
    x->x_gui.x_w = (w + (x->x_gui.x_h/2)/IEMGUI_ZOOM(x) + 4) * IEMGUI_ZOOM(x);
}